

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Metadata.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_MetadataInteger(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _List_node_base *p_Var9;
  string *extraout_RDX;
  string *psVar10;
  uint uVar11;
  ulong uVar12;
  CX3DImporter_NodeElement *ne;
  string an;
  string use;
  string def;
  vector<int,_std::allocator<int>_> value;
  string reference;
  string name;
  CX3DImporter_NodeElement *local_108;
  allocator<char> local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  vector<int,_std::allocator<int>_> local_98;
  string local_78;
  string local_58;
  X3DImporter *local_38;
  undefined4 extraout_var_00;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_108 = (CX3DImporter_NodeElement *)0x0;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar7) {
    uVar12 = 0;
    local_38 = this;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar8 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar12);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,(char *)CONCAT44(extraout_var,iVar8),&local_f9);
      iVar8 = std::__cxx11::string::compare((char *)&local_f8);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar8);
        psVar10 = &local_b8;
LAB_00648215:
        pcVar3 = (char *)psVar10->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar10,0,pcVar3,(ulong)__s);
        this = local_38;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_f8);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar8);
          psVar10 = &local_d8;
          goto LAB_00648215;
        }
        iVar8 = std::__cxx11::string::compare((char *)&local_f8);
        if (((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)&local_f8), iVar8 != 0))
           && (iVar8 = std::__cxx11::string::compare((char *)&local_f8), iVar8 != 0)) {
          iVar8 = std::__cxx11::string::compare((char *)&local_f8);
          if (iVar8 == 0) {
            iVar8 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
            __s = (char *)CONCAT44(extraout_var_02,iVar8);
            psVar10 = &local_58;
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_f8);
            if (iVar8 != 0) {
              iVar8 = std::__cxx11::string::compare((char *)&local_f8);
              if (iVar8 == 0) {
                XML_ReadNode_GetAttrVal_AsArrI32(this,(int)uVar12,&local_98);
              }
              else {
                Throw_IncorrectAttr(this,&local_f8);
              }
              goto LAB_0064823c;
            }
            iVar8 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
            __s = (char *)CONCAT44(extraout_var_03,iVar8);
            psVar10 = &local_78;
          }
          goto LAB_00648215;
        }
      }
LAB_0064823c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar7 != uVar11);
  }
  if (local_d8._M_string_length == 0) {
    local_108 = (CX3DImporter_NodeElement *)operator_new(0xa8);
    pCVar4 = this->NodeElement_Cur;
    local_108->Type = ENET_MetaInteger;
    (local_108->ID)._M_dataplus._M_p = (pointer)&(local_108->ID).field_2;
    (local_108->ID)._M_string_length = 0;
    (local_108->ID).field_2._M_local_buf[0] = '\0';
    local_108->Parent = pCVar4;
    (local_108->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_108->Child;
    (local_108->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_108->Child;
    (local_108->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_108[1]._vptr_CX3DImporter_NodeElement = (_func_int **)&local_108[1].ID;
    *(undefined8 *)&local_108[1].Type = 0;
    *(undefined1 *)&local_108[1].ID._M_dataplus._M_p = 0;
    local_108[1].ID.field_2._M_allocated_capacity = (size_type)&local_108[1].Parent;
    *(undefined8 *)((long)&local_108[1].ID.field_2 + 8) = 0;
    *(undefined1 *)&local_108[1].Parent = 0;
    local_108->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_MetaInteger_008f47c0;
    local_108[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    local_108[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_108[2]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    if (local_b8._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_108->ID);
    }
    std::__cxx11::string::_M_assign((string *)local_108[1].ID.field_2._M_local_buf);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)
               &local_108[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_prev,&local_98);
    iVar8 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar4 = local_108;
    if ((char)iVar8 == '\0') {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"MetadataInteger","");
      ParseNode_Metadata(this,pCVar4,extraout_RDX);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = (_List_node_base *)local_108;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_108;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_b8._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_d8,ENET_MetaInteger,&local_108);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_d8);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_108;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &pCVar4->Child;
  }
  psVar1 = &(plVar5->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_MetadataInteger()
{
    std::string def, use;
    std::string name, reference;
    std::vector<int32_t> value;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("name", name, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("reference", reference, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_REF("value", value, XML_ReadNode_GetAttrVal_AsArrI32);
	MACRO_ATTRREAD_LOOPEND;

	MACRO_METADATA_FINDCREATE(def, use, reference, value, ne, CX3DImporter_NodeElement_MetaInteger, "MetadataInteger", ENET_MetaInteger);
}